

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * cmd_ln_parse_r(ps_config_t *inout_cmdln,ps_arg_t *defn,int32 argc,char **argv,int strict)

{
  int iVar1;
  int32 iVar2;
  hash_table_t *h;
  ps_arg_t *ppVar3;
  cmd_ln_val_t *val;
  char *fmt;
  uint uVar4;
  ulong uVar5;
  ps_arg_t *val_00;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  void *v;
  cmd_ln_val_t *local_40;
  ps_config_t *local_38;
  
  local_38 = inout_cmdln;
  if (inout_cmdln == (ps_config_t *)0x0) {
    inout_cmdln = ps_config_init(defn);
    inout_cmdln->defn = defn;
  }
  uVar4 = 0;
  h = hash_table_new(0x32,0);
  uVar7 = 0;
  if ((defn != (ps_arg_t *)0x0) && (pcVar6 = defn->name, pcVar6 != (char *)0x0)) {
    uVar7 = 0;
    val_00 = defn;
    do {
      ppVar3 = (ps_arg_t *)hash_table_enter(h,pcVar6,val_00);
      if ((strict != 0) && (val_00 != ppVar3)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x140,"Duplicate argument name in definition: %s\n",val_00->name);
        goto LAB_0010b32d;
      }
      pcVar6 = val_00[1].name;
      val_00 = val_00 + 1;
      uVar7 = uVar7 + 1;
    } while (pcVar6 != (char *)0x0);
  }
  if (0 < argc) {
    uVar4 = (uint)(**argv != '-');
  }
  if ((int)uVar4 < argc) {
    uVar5 = (ulong)uVar4;
    do {
      pcVar6 = argv[uVar5];
      pcVar6 = pcVar6 + (ulong)(pcVar6[*pcVar6 == '-'] == '-') + (ulong)(*pcVar6 == '-');
      iVar2 = hash_table_lookup(h,pcVar6,&local_40);
      iVar1 = (int)uVar5;
      if (iVar2 < 0) {
        if (strict != 0) {
          fmt = "Unknown argument name \'%s\'\n";
          lVar8 = 0x15f;
          goto LAB_0010b319;
        }
        if (defn == (ps_arg_t *)0x0) {
          local_40 = (cmd_ln_val_t *)0x0;
          if (iVar1 + 1 < argc) goto LAB_0010b16f;
          goto LAB_0010b2c3;
        }
      }
      else {
        if (argc <= iVar1 + 1) {
LAB_0010b2c3:
          fmt = "Argument value for \'%s\' missing\n";
          lVar8 = 0x16b;
LAB_0010b319:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,lVar8,fmt,pcVar6);
LAB_0010b32d:
          if (h != (hash_table_t *)0x0) {
            hash_table_free(h);
          }
          if (local_38 == (ps_config_t *)0x0) {
            ps_config_free(inout_cmdln);
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x19e,"Failed to parse arguments list\n");
          return (cmd_ln_t *)0x0;
        }
        if (local_40 == (cmd_ln_val_t *)0x0) {
LAB_0010b16f:
          val = cmd_ln_val_init(8,pcVar6,argv[iVar1 + 1]);
        }
        else {
          val = cmd_ln_val_init(local_40->type,pcVar6,argv[uVar5 + 1]);
          if (val == (cmd_ln_val_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                    ,0x173,"Bad argument value for %s: %s\n",pcVar6,argv[uVar5 + 1]);
            goto LAB_0010b32d;
          }
        }
        local_40 = (cmd_ln_val_t *)hash_table_enter(inout_cmdln->ht,val->name,val);
        if (local_40 != val) {
          local_40 = (cmd_ln_val_t *)hash_table_replace(inout_cmdln->ht,val->name,val);
          cmd_ln_val_free(local_40);
        }
      }
      uVar5 = uVar5 + 2;
    } while ((int)uVar5 < argc);
  }
  if (uVar7 != 0) {
    lVar8 = 0;
    do {
      if (((*(byte *)((long)&defn->type + lVar8) & 1) != 0) &&
         (iVar2 = hash_table_lookup(inout_cmdln->ht,*(char **)((long)&defn->name + lVar8),&local_40)
         , iVar2 != 0)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x186,"Missing required argument %s\n",*(undefined8 *)((long)&defn->name + lVar8));
      }
      lVar8 = lVar8 + 0x20;
    } while ((ulong)uVar7 << 5 != lVar8);
  }
  if (argc == 1 && strict != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x18e,"No arguments given\n");
    if (h != (hash_table_t *)0x0) {
      hash_table_free(h);
    }
    if (local_38 == (ps_config_t *)0x0) {
      ps_config_free(inout_cmdln);
    }
    inout_cmdln = (cmd_ln_t *)0x0;
  }
  else {
    hash_table_free(h);
  }
  return inout_cmdln;
}

Assistant:

ps_config_t *
cmd_ln_parse_r(ps_config_t *inout_cmdln, const ps_arg_t * defn,
               int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    ps_config_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = ps_config_init(defn);
        cmdln->defn = defn;
    }
    else /* FIXME: definitions should just be in the ps_config_t */
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* skip argv[0] if it doesn't start with dash (starting with a
     * dash would only happen if called from parse_options()) */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        ps_arg_t *argdef;
        cmd_ln_val_t *val;
        char *name;
        void *v;

        name = argv[j];
        if (*name && *name == '-')
            ++name;
        if (*name && *name == '-')
            ++name;
        if (hash_table_lookup(defidx, name, &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", name);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (ps_arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            E_ERROR("Argument value for '%s' missing\n", name);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, name, argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, name, argv[j + 1])) == NULL) {
                E_ERROR("Bad argument value for %s: %s\n", name, argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            v = hash_table_replace(cmdln->ht, val->name, (void *)val);
            cmd_ln_val_free((cmd_ln_val_t *)v);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given\n");
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            ps_config_free(cmdln);
        return NULL;
    }

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        ps_config_free(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}